

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void last_valueInvFunc(sqlite3_context *pCtx,int nArg,sqlite3_value **apArg)

{
  int *piVar1;
  char *pcVar2;
  
  if ((short)pCtx->pMem->flags < 0) {
    pcVar2 = pCtx->pMem->z;
  }
  else {
    pcVar2 = (char *)createAggContext(pCtx,0x10);
  }
  if (pcVar2 != (char *)0x0) {
    piVar1 = (int *)(pcVar2 + 8);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      sqlite3ValueFree(*(sqlite3_value **)pcVar2);
      pcVar2[0] = '\0';
      pcVar2[1] = '\0';
      pcVar2[2] = '\0';
      pcVar2[3] = '\0';
      pcVar2[4] = '\0';
      pcVar2[5] = '\0';
      pcVar2[6] = '\0';
      pcVar2[7] = '\0';
    }
  }
  return;
}

Assistant:

static void last_valueInvFunc(
  sqlite3_context *pCtx,
  int nArg,
  sqlite3_value **apArg
){
  struct LastValueCtx *p;
  UNUSED_PARAMETER(nArg);
  UNUSED_PARAMETER(apArg);
  p = (struct LastValueCtx*)sqlite3_aggregate_context(pCtx, sizeof(*p));
  if( ALWAYS(p) ){
    p->nVal--;
    if( p->nVal==0 ){
      sqlite3_value_free(p->pVal);
      p->pVal = 0;
    }
  }
}